

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::SubGridIntersectorKPluecker<4,_8,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  ushort uVar2;
  ushort uVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  int iVar25;
  long lVar26;
  size_t sVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  RayK<8> *pRVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  bool bVar40;
  bool bVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar45 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar57;
  float fVar58;
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  float fVar59;
  undefined1 auVar56 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  float fVar87;
  float fVar93;
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [64];
  undefined1 auVar98 [16];
  undefined1 auVar97 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [64];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [64];
  float fVar113;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar116 [64];
  undefined1 auVar123 [32];
  undefined1 auVar124 [64];
  float fVar125;
  undefined1 auVar126 [32];
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar135 [32];
  float fVar145;
  float fVar147;
  float fVar148;
  float fVar149;
  undefined1 auVar146 [32];
  float fVar150;
  float fVar152;
  undefined1 auVar151 [32];
  RTCFilterFunctionNArguments args;
  float old_t;
  NodeRef stack [244];
  undefined1 local_e81;
  size_t local_e80;
  RayK<8> *local_e78;
  uint local_e70;
  uint local_e6c;
  ulong local_e68;
  undefined1 local_e60 [32];
  undefined1 local_e40 [32];
  ulong local_e08;
  ulong local_e00;
  ulong local_df8;
  long local_df0;
  long local_de8;
  ulong *local_de0;
  ulong local_dd8;
  long local_dd0;
  long local_dc8;
  ulong local_dc0;
  ulong local_db8;
  ulong local_db0;
  ulong local_da8;
  ulong local_da0;
  ulong local_d98;
  long local_d90;
  ulong local_d88;
  undefined1 local_d80 [16];
  undefined1 local_d70 [16];
  float local_d60;
  float fStack_d5c;
  float fStack_d58;
  float fStack_d54;
  RTCFilterFunctionNArguments local_d50;
  undefined1 local_d20 [32];
  undefined1 local_d00 [32];
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined1 local_ca0 [32];
  float local_c80;
  float fStack_c7c;
  float fStack_c78;
  float fStack_c74;
  float local_c70;
  float fStack_c6c;
  float fStack_c68;
  float fStack_c64;
  float local_c60;
  float fStack_c5c;
  float fStack_c58;
  float fStack_c54;
  float local_c50;
  float fStack_c4c;
  float fStack_c48;
  float fStack_c44;
  float local_c40;
  float fStack_c3c;
  float fStack_c38;
  float fStack_c34;
  undefined1 local_c30 [16];
  undefined1 local_c20 [16];
  undefined1 local_c10 [16];
  undefined1 local_c00 [32];
  undefined1 local_be0 [32];
  undefined1 local_bc0 [8];
  float fStack_bb8;
  float fStack_bb4;
  float fStack_bb0;
  float fStack_bac;
  float fStack_ba8;
  undefined1 local_ba0 [32];
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 *local_a20;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  float local_980 [4];
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  undefined4 uStack_964;
  float local_960 [4];
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined4 uStack_944;
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined1 local_900 [32];
  undefined4 local_8e0;
  undefined4 uStack_8dc;
  undefined4 uStack_8d8;
  undefined4 uStack_8d4;
  undefined4 uStack_8d0;
  undefined4 uStack_8cc;
  undefined4 uStack_8c8;
  undefined4 uStack_8c4;
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_de0 = local_7f8;
  local_800 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_c10._4_4_ = uVar1;
  local_c10._0_4_ = uVar1;
  local_c10._8_4_ = uVar1;
  local_c10._12_4_ = uVar1;
  auVar112 = ZEXT1664(local_c10);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_c20._4_4_ = uVar1;
  local_c20._0_4_ = uVar1;
  local_c20._8_4_ = uVar1;
  local_c20._12_4_ = uVar1;
  auVar116 = ZEXT1664(local_c20);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_c30._4_4_ = uVar1;
  local_c30._0_4_ = uVar1;
  local_c30._8_4_ = uVar1;
  local_c30._12_4_ = uVar1;
  auVar124 = ZEXT1664(local_c30);
  fVar145 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar150 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar87 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar125 = fVar145 * 0.99999964;
  fVar127 = fVar150 * 0.99999964;
  fVar133 = fVar87 * 0.99999964;
  fVar145 = fVar145 * 1.0000004;
  fVar150 = fVar150 * 1.0000004;
  fVar87 = fVar87 * 1.0000004;
  uVar34 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_d88 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar36 = uVar34 ^ 0x10;
  uVar39 = uVar35 ^ 0x10;
  uVar29 = local_d88 ^ 0x10;
  iVar25 = (tray->tnear).field_0.i[k];
  local_d70._4_4_ = iVar25;
  local_d70._0_4_ = iVar25;
  local_d70._8_4_ = iVar25;
  local_d70._12_4_ = iVar25;
  auVar96 = ZEXT1664(local_d70);
  iVar25 = (tray->tfar).field_0.i[k];
  local_d80._4_4_ = iVar25;
  local_d80._0_4_ = iVar25;
  local_d80._8_4_ = iVar25;
  local_d80._12_4_ = iVar25;
  auVar105 = ZEXT1664(local_d80);
  local_d98 = uVar34 >> 2;
  local_da0 = uVar36 >> 2;
  local_da8 = uVar35 >> 2;
  local_ba0._16_16_ = mm_lookupmask_ps._240_16_;
  local_ba0._0_16_ = mm_lookupmask_ps._0_16_;
  iVar25 = 1 << ((uint)k & 0x1f);
  local_db0 = uVar39 >> 2;
  local_db8 = local_d88 >> 2;
  local_dc0 = uVar29 >> 2;
  auVar46._4_4_ = iVar25;
  auVar46._0_4_ = iVar25;
  auVar46._8_4_ = iVar25;
  auVar46._12_4_ = iVar25;
  auVar46._16_4_ = iVar25;
  auVar46._20_4_ = iVar25;
  auVar46._24_4_ = iVar25;
  auVar46._28_4_ = iVar25;
  auVar47 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar46 = vpand_avx2(auVar46,auVar47);
  local_c00 = vpcmpeqd_avx2(auVar46,auVar47);
  auVar54._8_4_ = 0x3f800000;
  auVar54._0_8_ = 0x3f8000003f800000;
  auVar54._12_4_ = 0x3f800000;
  auVar54._16_4_ = 0x3f800000;
  auVar54._20_4_ = 0x3f800000;
  auVar54._24_4_ = 0x3f800000;
  auVar54._28_4_ = 0x3f800000;
  auVar47._8_4_ = 0xbf800000;
  auVar47._0_8_ = 0xbf800000bf800000;
  auVar47._12_4_ = 0xbf800000;
  auVar47._16_4_ = 0xbf800000;
  auVar47._20_4_ = 0xbf800000;
  auVar47._24_4_ = 0xbf800000;
  auVar47._28_4_ = 0xbf800000;
  _local_bc0 = vblendvps_avx(auVar54,auVar47,local_ba0);
  bVar41 = true;
  fVar93 = fVar87;
  fVar113 = fVar87;
  fVar57 = fVar87;
  fVar58 = fVar125;
  fVar59 = fVar125;
  fVar60 = fVar125;
  fVar61 = fVar127;
  fVar62 = fVar127;
  fVar131 = fVar127;
  fVar136 = fVar133;
  fVar138 = fVar133;
  fVar140 = fVar133;
  fVar147 = fVar145;
  fVar148 = fVar145;
  fVar149 = fVar145;
  fVar152 = fVar150;
  fVar117 = fVar150;
  fVar118 = fVar150;
  local_e80 = k;
  local_e78 = ray;
  local_e00 = uVar35;
  local_df8 = uVar34;
  local_d60 = fVar87;
  fStack_d5c = fVar87;
  fStack_d58 = fVar87;
  fStack_d54 = fVar87;
  local_c80 = fVar150;
  fStack_c7c = fVar150;
  fStack_c78 = fVar150;
  fStack_c74 = fVar150;
  local_c70 = fVar145;
  fStack_c6c = fVar145;
  fStack_c68 = fVar145;
  fStack_c64 = fVar145;
  local_c60 = fVar133;
  fStack_c5c = fVar133;
  fStack_c58 = fVar133;
  fStack_c54 = fVar133;
  local_c50 = fVar127;
  fStack_c4c = fVar127;
  fStack_c48 = fVar127;
  fStack_c44 = fVar127;
  local_c40 = fVar125;
  fStack_c3c = fVar125;
  fStack_c38 = fVar125;
  fStack_c34 = fVar125;
  do {
    uVar37 = local_de0[-1];
    local_de0 = local_de0 + -1;
    while ((uVar37 & 8) == 0) {
      auVar45 = vsubps_avx(*(undefined1 (*) [16])(uVar37 + 0x20 + uVar34),auVar112._0_16_);
      auVar42._0_4_ = fVar125 * auVar45._0_4_;
      auVar42._4_4_ = fVar58 * auVar45._4_4_;
      auVar42._8_4_ = fVar59 * auVar45._8_4_;
      auVar42._12_4_ = fVar60 * auVar45._12_4_;
      auVar45 = vsubps_avx(*(undefined1 (*) [16])(uVar37 + 0x20 + uVar35),auVar116._0_16_);
      auVar51._0_4_ = fVar127 * auVar45._0_4_;
      auVar51._4_4_ = fVar61 * auVar45._4_4_;
      auVar51._8_4_ = fVar62 * auVar45._8_4_;
      auVar51._12_4_ = fVar131 * auVar45._12_4_;
      auVar45 = vmaxps_avx(auVar42,auVar51);
      auVar42 = vsubps_avx(*(undefined1 (*) [16])(uVar37 + 0x20 + local_d88),auVar124._0_16_);
      auVar52._0_4_ = fVar133 * auVar42._0_4_;
      auVar52._4_4_ = fVar136 * auVar42._4_4_;
      auVar52._8_4_ = fVar138 * auVar42._8_4_;
      auVar52._12_4_ = fVar140 * auVar42._12_4_;
      auVar42 = vsubps_avx(*(undefined1 (*) [16])(uVar37 + 0x20 + uVar36),auVar112._0_16_);
      auVar63._0_4_ = fVar145 * auVar42._0_4_;
      auVar63._4_4_ = fVar147 * auVar42._4_4_;
      auVar63._8_4_ = fVar148 * auVar42._8_4_;
      auVar63._12_4_ = fVar149 * auVar42._12_4_;
      auVar42 = vsubps_avx(*(undefined1 (*) [16])(uVar37 + 0x20 + uVar39),auVar116._0_16_);
      auVar74._0_4_ = fVar150 * auVar42._0_4_;
      auVar74._4_4_ = fVar152 * auVar42._4_4_;
      auVar74._8_4_ = fVar117 * auVar42._8_4_;
      auVar74._12_4_ = fVar118 * auVar42._12_4_;
      auVar51 = vminps_avx(auVar63,auVar74);
      auVar42 = vsubps_avx(*(undefined1 (*) [16])(uVar37 + 0x20 + uVar29),auVar124._0_16_);
      auVar75._0_4_ = fVar87 * auVar42._0_4_;
      auVar75._4_4_ = fVar93 * auVar42._4_4_;
      auVar75._8_4_ = fVar113 * auVar42._8_4_;
      auVar75._12_4_ = fVar57 * auVar42._12_4_;
      auVar42 = vmaxps_avx(auVar52,auVar96._0_16_);
      auVar45 = vmaxps_avx(auVar45,auVar42);
      auVar42 = vminps_avx(auVar75,auVar105._0_16_);
      auVar42 = vminps_avx(auVar51,auVar42);
      auVar45 = vcmpps_avx(auVar45,auVar42,2);
      uVar28 = vmovmskps_avx(auVar45);
      if (uVar28 == 0) goto LAB_005a6042;
      uVar28 = uVar28 & 0xff;
      uVar38 = uVar37 & 0xfffffffffffffff0;
      lVar26 = 0;
      for (uVar37 = (ulong)uVar28; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
        lVar26 = lVar26 + 1;
      }
      uVar37 = *(ulong *)(uVar38 + lVar26 * 8);
      uVar28 = uVar28 - 1 & uVar28;
      uVar30 = (ulong)uVar28;
      if (uVar28 != 0) {
        *local_de0 = uVar37;
        lVar26 = 0;
        for (; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
          lVar26 = lVar26 + 1;
        }
        uVar28 = uVar28 - 1 & uVar28;
        uVar30 = (ulong)uVar28;
        bVar40 = uVar28 == 0;
        while( true ) {
          local_de0 = local_de0 + 1;
          uVar37 = *(ulong *)(uVar38 + lVar26 * 8);
          if (bVar40) break;
          *local_de0 = uVar37;
          lVar26 = 0;
          for (uVar37 = uVar30; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000) {
            lVar26 = lVar26 + 1;
          }
          uVar30 = uVar30 - 1 & uVar30;
          bVar40 = uVar30 == 0;
        }
      }
    }
    local_de8 = (ulong)((uint)uVar37 & 0xf) - 8;
    if (local_de8 != 0) {
      uVar37 = uVar37 & 0xfffffffffffffff0;
      local_df0 = 0;
      do {
        lVar26 = local_df0 * 0x58;
        local_d90 = lVar26 + uVar37;
        uVar1 = *(undefined4 *)(uVar37 + 0x38 + lVar26);
        auVar64._4_4_ = uVar1;
        auVar64._0_4_ = uVar1;
        auVar64._8_4_ = uVar1;
        auVar64._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(uVar37 + 0x44 + lVar26);
        auVar76._4_4_ = uVar1;
        auVar76._0_4_ = uVar1;
        auVar76._8_4_ = uVar1;
        auVar76._12_4_ = uVar1;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = *(ulong *)(local_d98 + 0x20 + local_d90);
        auVar45 = vpmovzxbd_avx(auVar45);
        auVar45 = vcvtdq2ps_avx(auVar45);
        auVar42 = vfmadd213ps_fma(auVar45,auVar76,auVar64);
        auVar43._8_8_ = 0;
        auVar43._0_8_ = *(ulong *)(local_da0 + 0x20 + local_d90);
        auVar45 = vpmovzxbd_avx(auVar43);
        auVar45 = vcvtdq2ps_avx(auVar45);
        auVar51 = vfmadd213ps_fma(auVar45,auVar76,auVar64);
        uVar1 = *(undefined4 *)(uVar37 + 0x3c + lVar26);
        auVar65._4_4_ = uVar1;
        auVar65._0_4_ = uVar1;
        auVar65._8_4_ = uVar1;
        auVar65._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(uVar37 + 0x48 + lVar26);
        auVar77._4_4_ = uVar1;
        auVar77._0_4_ = uVar1;
        auVar77._8_4_ = uVar1;
        auVar77._12_4_ = uVar1;
        auVar88._8_8_ = 0;
        auVar88._0_8_ = *(ulong *)(local_da8 + 0x20 + local_d90);
        auVar45 = vpmovzxbd_avx(auVar88);
        auVar45 = vcvtdq2ps_avx(auVar45);
        auVar63 = vfmadd213ps_fma(auVar45,auVar77,auVar65);
        auVar94._8_8_ = 0;
        auVar94._0_8_ = *(ulong *)(local_db0 + 0x20 + local_d90);
        auVar45 = vpmovzxbd_avx(auVar94);
        auVar45 = vcvtdq2ps_avx(auVar45);
        auVar74 = vfmadd213ps_fma(auVar45,auVar77,auVar65);
        uVar1 = *(undefined4 *)(uVar37 + 0x40 + lVar26);
        auVar66._4_4_ = uVar1;
        auVar66._0_4_ = uVar1;
        auVar66._8_4_ = uVar1;
        auVar66._12_4_ = uVar1;
        uVar1 = *(undefined4 *)(uVar37 + 0x4c + lVar26);
        auVar78._4_4_ = uVar1;
        auVar78._0_4_ = uVar1;
        auVar78._8_4_ = uVar1;
        auVar78._12_4_ = uVar1;
        auVar97._8_8_ = 0;
        auVar97._0_8_ = *(ulong *)(local_db8 + 0x20 + local_d90);
        auVar45 = vpmovzxbd_avx(auVar97);
        auVar45 = vcvtdq2ps_avx(auVar45);
        auVar75 = vfmadd213ps_fma(auVar45,auVar78,auVar66);
        auVar106._8_8_ = 0;
        auVar106._0_8_ = *(ulong *)(local_dc0 + 0x20 + local_d90);
        auVar45 = vpmovzxbd_avx(auVar106);
        auVar45 = vcvtdq2ps_avx(auVar45);
        auVar43 = vfmadd213ps_fma(auVar45,auVar78,auVar66);
        auVar67._8_8_ = 0;
        auVar67._0_8_ = *(ulong *)(uVar37 + 0x20 + lVar26);
        auVar79._8_8_ = 0;
        auVar79._0_8_ = *(ulong *)(uVar37 + 0x24 + lVar26);
        auVar45 = vpminub_avx(auVar67,auVar79);
        auVar52 = vpcmpeqb_avx(auVar67,auVar45);
        auVar45 = vsubps_avx(auVar42,auVar112._0_16_);
        auVar53._0_4_ = fVar125 * auVar45._0_4_;
        auVar53._4_4_ = fVar58 * auVar45._4_4_;
        auVar53._8_4_ = fVar59 * auVar45._8_4_;
        auVar53._12_4_ = fVar60 * auVar45._12_4_;
        auVar45 = vsubps_avx(auVar63,auVar116._0_16_);
        auVar80._0_4_ = fVar127 * auVar45._0_4_;
        auVar80._4_4_ = fVar61 * auVar45._4_4_;
        auVar80._8_4_ = fVar62 * auVar45._8_4_;
        auVar80._12_4_ = fVar131 * auVar45._12_4_;
        auVar45 = vmaxps_avx(auVar53,auVar80);
        auVar42 = vsubps_avx(auVar51,auVar112._0_16_);
        auVar44._0_4_ = fVar145 * auVar42._0_4_;
        auVar44._4_4_ = fVar147 * auVar42._4_4_;
        auVar44._8_4_ = fVar148 * auVar42._8_4_;
        auVar44._12_4_ = fVar149 * auVar42._12_4_;
        auVar42 = vsubps_avx(auVar74,auVar116._0_16_);
        auVar81._0_4_ = fVar150 * auVar42._0_4_;
        auVar81._4_4_ = fVar152 * auVar42._4_4_;
        auVar81._8_4_ = fVar117 * auVar42._8_4_;
        auVar81._12_4_ = fVar118 * auVar42._12_4_;
        auVar51 = vminps_avx(auVar44,auVar81);
        auVar42 = vsubps_avx(auVar75,auVar124._0_16_);
        auVar82._0_4_ = fVar133 * auVar42._0_4_;
        auVar82._4_4_ = fVar136 * auVar42._4_4_;
        auVar82._8_4_ = fVar138 * auVar42._8_4_;
        auVar82._12_4_ = fVar140 * auVar42._12_4_;
        auVar42 = vmaxps_avx(auVar82,local_d70);
        auVar45 = vmaxps_avx(auVar45,auVar42);
        auVar42 = vsubps_avx(auVar43,auVar124._0_16_);
        auVar83._0_4_ = local_d60 * auVar42._0_4_;
        auVar83._4_4_ = fStack_d5c * auVar42._4_4_;
        auVar83._8_4_ = fStack_d58 * auVar42._8_4_;
        auVar83._12_4_ = fStack_d54 * auVar42._12_4_;
        auVar42 = vminps_avx(auVar83,local_d80);
        auVar42 = vminps_avx(auVar51,auVar42);
        auVar45 = vcmpps_avx(auVar45,auVar42,2);
        auVar42 = vpmovzxbd_avx(auVar52 ^ _DAT_01f7ae20);
        auVar45 = vpandn_avx(auVar42,auVar45);
        auVar45 = vpslld_avx(auVar45,0x1f);
        uVar28 = vmovmskps_avx(auVar45);
        if (uVar28 != 0) {
          local_dd8 = (ulong)(uVar28 & 0xff);
          do {
            lVar26 = 0;
            for (uVar34 = local_dd8; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
              lVar26 = lVar26 + 1;
            }
            uVar2 = *(ushort *)(local_d90 + lVar26 * 8);
            uVar3 = *(ushort *)(local_d90 + 2 + lVar26 * 8);
            local_cc0._4_4_ = *(uint *)(local_d90 + 0x50);
            local_e68 = (ulong)local_cc0._4_4_;
            local_ce0._4_4_ = *(uint *)(local_d90 + 4 + lVar26 * 8);
            local_e08 = (ulong)local_ce0._4_4_;
            pGVar4 = (context->scene->geometries).items[local_e68].ptr;
            local_dc8 = *(long *)&pGVar4->field_0x58;
            local_dd0 = pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i
                        * local_e08;
            local_e6c = uVar2 & 0x7fff;
            local_e70 = uVar3 & 0x7fff;
            uVar28 = *(uint *)(local_dc8 + 4 + local_dd0);
            uVar35 = (ulong)uVar28;
            uVar38 = (ulong)(uVar28 * local_e70 + *(int *)(local_dc8 + local_dd0) + local_e6c);
            lVar26 = *(long *)&pGVar4[1].time_range.upper;
            p_Var5 = pGVar4[1].intersectionFilterN;
            auVar45 = *(undefined1 (*) [16])(lVar26 + (uVar38 + 1) * (long)p_Var5);
            auVar42 = *(undefined1 (*) [16])(lVar26 + (uVar38 + uVar35) * (long)p_Var5);
            lVar31 = uVar38 + uVar35 + 1;
            auVar51 = *(undefined1 (*) [16])(lVar26 + lVar31 * (long)p_Var5);
            auVar52 = *(undefined1 (*) [16])
                       (lVar26 + (uVar38 + (-1 < (short)uVar2) + 1) * (long)p_Var5);
            lVar32 = (ulong)(-1 < (short)uVar2) + lVar31;
            uVar34 = 0;
            if (-1 < (short)uVar3) {
              uVar34 = uVar35;
            }
            auVar63 = *(undefined1 (*) [16])(lVar26 + lVar32 * (long)p_Var5);
            auVar74 = *(undefined1 (*) [16])(lVar26 + (uVar38 + uVar35 + uVar34) * (long)p_Var5);
            auVar75 = *(undefined1 (*) [16])(lVar26 + (lVar31 + uVar34) * (long)p_Var5);
            auVar109._16_16_ = *(undefined1 (*) [16])(lVar26 + (uVar34 + lVar32) * (long)p_Var5);
            auVar109._0_16_ = auVar51;
            auVar44 = vunpcklps_avx(auVar45,auVar63);
            auVar43 = vunpckhps_avx(auVar45,auVar63);
            auVar53 = vunpcklps_avx(auVar52,auVar51);
            auVar52 = vunpckhps_avx(auVar52,auVar51);
            auVar64 = vunpcklps_avx(auVar43,auVar52);
            auVar65 = vunpcklps_avx(auVar44,auVar53);
            auVar52 = vunpckhps_avx(auVar44,auVar53);
            auVar44 = vunpcklps_avx(auVar42,auVar75);
            auVar43 = vunpckhps_avx(auVar42,auVar75);
            auVar53 = vunpcklps_avx(auVar51,auVar74);
            auVar74 = vunpckhps_avx(auVar51,auVar74);
            auVar43 = vunpcklps_avx(auVar43,auVar74);
            auVar66 = vunpcklps_avx(auVar44,auVar53);
            auVar74 = vunpckhps_avx(auVar44,auVar53);
            auVar68._16_16_ = auVar75;
            auVar68._0_16_ = auVar42;
            auVar55._16_16_ = auVar63;
            auVar55._0_16_ = auVar45;
            auVar46 = vunpcklps_avx(auVar55,auVar68);
            auVar48._16_16_ = auVar51;
            auVar48._0_16_ = *(undefined1 (*) [16])(lVar26 + (long)p_Var5 * uVar38);
            auVar47 = vunpcklps_avx(auVar48,auVar109);
            auVar108 = vunpcklps_avx(auVar47,auVar46);
            auVar46 = vunpckhps_avx(auVar47,auVar46);
            auVar47 = vunpckhps_avx(auVar55,auVar68);
            auVar54 = vunpckhps_avx(auVar48,auVar109);
            auVar47 = vunpcklps_avx(auVar54,auVar47);
            auVar151._16_16_ = auVar65;
            auVar151._0_16_ = auVar65;
            auVar69._16_16_ = auVar52;
            auVar69._0_16_ = auVar52;
            auVar89._16_16_ = auVar64;
            auVar89._0_16_ = auVar64;
            auVar110._16_16_ = auVar66;
            auVar110._0_16_ = auVar66;
            auVar114._16_16_ = auVar74;
            auVar114._0_16_ = auVar74;
            uVar1 = *(undefined4 *)(local_e78 + local_e80 * 4);
            auVar123._4_4_ = uVar1;
            auVar123._0_4_ = uVar1;
            auVar123._8_4_ = uVar1;
            auVar123._12_4_ = uVar1;
            auVar123._16_4_ = uVar1;
            auVar123._20_4_ = uVar1;
            auVar123._24_4_ = uVar1;
            auVar123._28_4_ = uVar1;
            uVar1 = *(undefined4 *)(local_e78 + local_e80 * 4 + 0x20);
            auVar126._4_4_ = uVar1;
            auVar126._0_4_ = uVar1;
            auVar126._8_4_ = uVar1;
            auVar126._12_4_ = uVar1;
            auVar126._16_4_ = uVar1;
            auVar126._20_4_ = uVar1;
            auVar126._24_4_ = uVar1;
            auVar126._28_4_ = uVar1;
            auVar99._16_16_ = auVar43;
            auVar99._0_16_ = auVar43;
            uVar1 = *(undefined4 *)(local_e78 + local_e80 * 4 + 0x40);
            auVar135._4_4_ = uVar1;
            auVar135._0_4_ = uVar1;
            auVar135._8_4_ = uVar1;
            auVar135._12_4_ = uVar1;
            auVar135._16_4_ = uVar1;
            auVar135._20_4_ = uVar1;
            auVar135._24_4_ = uVar1;
            auVar135._28_4_ = uVar1;
            auVar108 = vsubps_avx(auVar108,auVar123);
            auVar48 = vsubps_avx(auVar46,auVar126);
            auVar46 = vsubps_avx(auVar47,auVar135);
            auVar47 = vsubps_avx(auVar151,auVar123);
            auVar54 = vsubps_avx(auVar69,auVar126);
            auVar104 = vsubps_avx(auVar89,auVar135);
            auVar55 = vsubps_avx(auVar110,auVar123);
            auVar68 = vsubps_avx(auVar114,auVar126);
            auVar6 = vsubps_avx(auVar99,auVar135);
            local_aa0 = vsubps_avx(auVar55,auVar108);
            auVar69 = vsubps_avx(auVar68,auVar48);
            local_ac0 = vsubps_avx(auVar6,auVar46);
            auVar49._0_4_ = auVar55._0_4_ + auVar108._0_4_;
            auVar49._4_4_ = auVar55._4_4_ + auVar108._4_4_;
            auVar49._8_4_ = auVar55._8_4_ + auVar108._8_4_;
            auVar49._12_4_ = auVar55._12_4_ + auVar108._12_4_;
            auVar49._16_4_ = auVar55._16_4_ + auVar108._16_4_;
            auVar49._20_4_ = auVar55._20_4_ + auVar108._20_4_;
            auVar49._24_4_ = auVar55._24_4_ + auVar108._24_4_;
            auVar49._28_4_ = auVar55._28_4_ + auVar108._28_4_;
            auVar70._0_4_ = auVar48._0_4_ + auVar68._0_4_;
            auVar70._4_4_ = auVar48._4_4_ + auVar68._4_4_;
            auVar70._8_4_ = auVar48._8_4_ + auVar68._8_4_;
            auVar70._12_4_ = auVar48._12_4_ + auVar68._12_4_;
            auVar70._16_4_ = auVar48._16_4_ + auVar68._16_4_;
            auVar70._20_4_ = auVar48._20_4_ + auVar68._20_4_;
            auVar70._24_4_ = auVar48._24_4_ + auVar68._24_4_;
            auVar70._28_4_ = auVar48._28_4_ + auVar68._28_4_;
            fVar145 = auVar46._0_4_;
            auVar100._0_4_ = auVar6._0_4_ + fVar145;
            fVar150 = auVar46._4_4_;
            auVar100._4_4_ = auVar6._4_4_ + fVar150;
            fVar87 = auVar46._8_4_;
            auVar100._8_4_ = auVar6._8_4_ + fVar87;
            fVar125 = auVar46._12_4_;
            auVar100._12_4_ = auVar6._12_4_ + fVar125;
            fVar127 = auVar46._16_4_;
            auVar100._16_4_ = auVar6._16_4_ + fVar127;
            fVar133 = auVar46._20_4_;
            auVar100._20_4_ = auVar6._20_4_ + fVar133;
            fVar93 = auVar46._24_4_;
            auVar100._24_4_ = auVar6._24_4_ + fVar93;
            auVar100._28_4_ = auVar6._28_4_ + auVar46._28_4_;
            auVar7._4_4_ = local_ac0._4_4_ * auVar70._4_4_;
            auVar7._0_4_ = local_ac0._0_4_ * auVar70._0_4_;
            auVar7._8_4_ = local_ac0._8_4_ * auVar70._8_4_;
            auVar7._12_4_ = local_ac0._12_4_ * auVar70._12_4_;
            auVar7._16_4_ = local_ac0._16_4_ * auVar70._16_4_;
            auVar7._20_4_ = local_ac0._20_4_ * auVar70._20_4_;
            auVar7._24_4_ = local_ac0._24_4_ * auVar70._24_4_;
            auVar7._28_4_ = uVar1;
            auVar42 = vfmsub231ps_fma(auVar7,auVar69,auVar100);
            auVar8._4_4_ = local_aa0._4_4_ * auVar100._4_4_;
            auVar8._0_4_ = local_aa0._0_4_ * auVar100._0_4_;
            auVar8._8_4_ = local_aa0._8_4_ * auVar100._8_4_;
            auVar8._12_4_ = local_aa0._12_4_ * auVar100._12_4_;
            auVar8._16_4_ = local_aa0._16_4_ * auVar100._16_4_;
            auVar8._20_4_ = local_aa0._20_4_ * auVar100._20_4_;
            auVar8._24_4_ = local_aa0._24_4_ * auVar100._24_4_;
            auVar8._28_4_ = auVar100._28_4_;
            auVar45 = vfmsub231ps_fma(auVar8,local_ac0,auVar49);
            auVar9._4_4_ = auVar69._4_4_ * auVar49._4_4_;
            auVar9._0_4_ = auVar69._0_4_ * auVar49._0_4_;
            auVar9._8_4_ = auVar69._8_4_ * auVar49._8_4_;
            auVar9._12_4_ = auVar69._12_4_ * auVar49._12_4_;
            auVar9._16_4_ = auVar69._16_4_ * auVar49._16_4_;
            auVar9._20_4_ = auVar69._20_4_ * auVar49._20_4_;
            auVar9._24_4_ = auVar69._24_4_ * auVar49._24_4_;
            auVar9._28_4_ = auVar49._28_4_;
            auVar51 = vfmsub231ps_fma(auVar9,local_aa0,auVar70);
            uVar1 = *(undefined4 *)(local_e78 + local_e80 * 4 + 0xa0);
            local_e40._4_4_ = uVar1;
            local_e40._0_4_ = uVar1;
            local_e40._8_4_ = uVar1;
            local_e40._12_4_ = uVar1;
            local_e40._16_4_ = uVar1;
            local_e40._20_4_ = uVar1;
            local_e40._24_4_ = uVar1;
            local_e40._28_4_ = uVar1;
            local_ae0 = *(float *)(local_e78 + local_e80 * 4 + 0xc0);
            auVar10._4_4_ = local_ae0 * auVar51._4_4_;
            auVar10._0_4_ = local_ae0 * auVar51._0_4_;
            auVar10._8_4_ = local_ae0 * auVar51._8_4_;
            auVar10._12_4_ = local_ae0 * auVar51._12_4_;
            auVar10._16_4_ = local_ae0 * 0.0;
            auVar10._20_4_ = local_ae0 * 0.0;
            auVar10._24_4_ = local_ae0 * 0.0;
            auVar10._28_4_ = auVar70._28_4_;
            auVar45 = vfmadd231ps_fma(auVar10,local_e40,ZEXT1632(auVar45));
            uVar1 = *(undefined4 *)(local_e78 + local_e80 * 4 + 0x80);
            local_e60._4_4_ = uVar1;
            local_e60._0_4_ = uVar1;
            local_e60._8_4_ = uVar1;
            local_e60._12_4_ = uVar1;
            local_e60._16_4_ = uVar1;
            local_e60._20_4_ = uVar1;
            local_e60._24_4_ = uVar1;
            local_e60._28_4_ = uVar1;
            auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),local_e60,ZEXT1632(auVar42));
            local_b00 = vsubps_avx(auVar48,auVar54);
            local_b20 = vsubps_avx(auVar46,auVar104);
            auVar146._0_4_ = auVar48._0_4_ + auVar54._0_4_;
            auVar146._4_4_ = auVar48._4_4_ + auVar54._4_4_;
            auVar146._8_4_ = auVar48._8_4_ + auVar54._8_4_;
            auVar146._12_4_ = auVar48._12_4_ + auVar54._12_4_;
            auVar146._16_4_ = auVar48._16_4_ + auVar54._16_4_;
            auVar146._20_4_ = auVar48._20_4_ + auVar54._20_4_;
            auVar146._24_4_ = auVar48._24_4_ + auVar54._24_4_;
            auVar146._28_4_ = auVar48._28_4_ + auVar54._28_4_;
            auVar101._0_4_ = fVar145 + auVar104._0_4_;
            auVar101._4_4_ = fVar150 + auVar104._4_4_;
            auVar101._8_4_ = fVar87 + auVar104._8_4_;
            auVar101._12_4_ = fVar125 + auVar104._12_4_;
            auVar101._16_4_ = fVar127 + auVar104._16_4_;
            auVar101._20_4_ = fVar133 + auVar104._20_4_;
            auVar101._24_4_ = fVar93 + auVar104._24_4_;
            fVar113 = auVar104._28_4_;
            auVar101._28_4_ = auVar46._28_4_ + fVar113;
            fVar57 = local_b20._0_4_;
            fVar59 = local_b20._4_4_;
            auVar11._4_4_ = auVar146._4_4_ * fVar59;
            auVar11._0_4_ = auVar146._0_4_ * fVar57;
            fVar61 = local_b20._8_4_;
            auVar11._8_4_ = auVar146._8_4_ * fVar61;
            fVar131 = local_b20._12_4_;
            auVar11._12_4_ = auVar146._12_4_ * fVar131;
            fVar138 = local_b20._16_4_;
            auVar11._16_4_ = auVar146._16_4_ * fVar138;
            fVar147 = local_b20._20_4_;
            auVar11._20_4_ = auVar146._20_4_ * fVar147;
            fVar149 = local_b20._24_4_;
            auVar11._24_4_ = auVar146._24_4_ * fVar149;
            auVar11._28_4_ = local_aa0._28_4_;
            auVar51 = vfmsub231ps_fma(auVar11,local_b00,auVar101);
            local_b40 = vsubps_avx(auVar108,auVar47);
            fVar58 = local_b40._0_4_;
            fVar60 = local_b40._4_4_;
            auVar12._4_4_ = auVar101._4_4_ * fVar60;
            auVar12._0_4_ = auVar101._0_4_ * fVar58;
            fVar62 = local_b40._8_4_;
            auVar12._8_4_ = auVar101._8_4_ * fVar62;
            fVar136 = local_b40._12_4_;
            auVar12._12_4_ = auVar101._12_4_ * fVar136;
            fVar140 = local_b40._16_4_;
            auVar12._16_4_ = auVar101._16_4_ * fVar140;
            fVar148 = local_b40._20_4_;
            auVar12._20_4_ = auVar101._20_4_ * fVar148;
            fVar152 = local_b40._24_4_;
            auVar12._24_4_ = auVar101._24_4_ * fVar152;
            auVar12._28_4_ = local_ac0._28_4_;
            auVar102._0_4_ = auVar108._0_4_ + auVar47._0_4_;
            auVar102._4_4_ = auVar108._4_4_ + auVar47._4_4_;
            auVar102._8_4_ = auVar108._8_4_ + auVar47._8_4_;
            auVar102._12_4_ = auVar108._12_4_ + auVar47._12_4_;
            auVar102._16_4_ = auVar108._16_4_ + auVar47._16_4_;
            auVar102._20_4_ = auVar108._20_4_ + auVar47._20_4_;
            auVar102._24_4_ = auVar108._24_4_ + auVar47._24_4_;
            auVar102._28_4_ = auVar108._28_4_ + auVar47._28_4_;
            auVar42 = vfmsub231ps_fma(auVar12,local_b20,auVar102);
            fVar134 = local_b00._0_4_;
            fVar137 = local_b00._4_4_;
            auVar13._4_4_ = fVar137 * auVar102._4_4_;
            auVar13._0_4_ = fVar134 * auVar102._0_4_;
            fVar139 = local_b00._8_4_;
            auVar13._8_4_ = fVar139 * auVar102._8_4_;
            fVar141 = local_b00._12_4_;
            auVar13._12_4_ = fVar141 * auVar102._12_4_;
            fVar142 = local_b00._16_4_;
            auVar13._16_4_ = fVar142 * auVar102._16_4_;
            fVar143 = local_b00._20_4_;
            auVar13._20_4_ = fVar143 * auVar102._20_4_;
            fVar144 = local_b00._24_4_;
            auVar13._24_4_ = fVar144 * auVar102._24_4_;
            auVar13._28_4_ = auVar102._28_4_;
            auVar52 = vfmsub231ps_fma(auVar13,local_b40,auVar146);
            auVar103._0_4_ = local_ae0 * auVar52._0_4_;
            auVar103._4_4_ = local_ae0 * auVar52._4_4_;
            auVar103._8_4_ = local_ae0 * auVar52._8_4_;
            auVar103._12_4_ = local_ae0 * auVar52._12_4_;
            auVar103._16_4_ = local_ae0 * 0.0;
            auVar103._20_4_ = local_ae0 * 0.0;
            auVar103._24_4_ = local_ae0 * 0.0;
            auVar103._28_4_ = 0;
            auVar42 = vfmadd231ps_fma(auVar103,local_e40,ZEXT1632(auVar42));
            auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),local_e60,ZEXT1632(auVar51));
            auVar7 = vsubps_avx(auVar47,auVar55);
            auVar90._0_4_ = auVar47._0_4_ + auVar55._0_4_;
            auVar90._4_4_ = auVar47._4_4_ + auVar55._4_4_;
            auVar90._8_4_ = auVar47._8_4_ + auVar55._8_4_;
            auVar90._12_4_ = auVar47._12_4_ + auVar55._12_4_;
            auVar90._16_4_ = auVar47._16_4_ + auVar55._16_4_;
            auVar90._20_4_ = auVar47._20_4_ + auVar55._20_4_;
            auVar90._24_4_ = auVar47._24_4_ + auVar55._24_4_;
            auVar90._28_4_ = auVar47._28_4_ + auVar55._28_4_;
            auVar55 = vsubps_avx(auVar54,auVar68);
            auVar107._0_4_ = auVar54._0_4_ + auVar68._0_4_;
            auVar107._4_4_ = auVar54._4_4_ + auVar68._4_4_;
            auVar107._8_4_ = auVar54._8_4_ + auVar68._8_4_;
            auVar107._12_4_ = auVar54._12_4_ + auVar68._12_4_;
            auVar107._16_4_ = auVar54._16_4_ + auVar68._16_4_;
            auVar107._20_4_ = auVar54._20_4_ + auVar68._20_4_;
            auVar107._24_4_ = auVar54._24_4_ + auVar68._24_4_;
            auVar107._28_4_ = auVar54._28_4_ + auVar68._28_4_;
            auVar68 = vsubps_avx(auVar104,auVar6);
            auVar84._0_4_ = auVar104._0_4_ + auVar6._0_4_;
            auVar84._4_4_ = auVar104._4_4_ + auVar6._4_4_;
            auVar84._8_4_ = auVar104._8_4_ + auVar6._8_4_;
            auVar84._12_4_ = auVar104._12_4_ + auVar6._12_4_;
            auVar84._16_4_ = auVar104._16_4_ + auVar6._16_4_;
            auVar84._20_4_ = auVar104._20_4_ + auVar6._20_4_;
            auVar84._24_4_ = auVar104._24_4_ + auVar6._24_4_;
            auVar84._28_4_ = fVar113 + auVar6._28_4_;
            auVar104._4_4_ = auVar107._4_4_ * auVar68._4_4_;
            auVar104._0_4_ = auVar107._0_4_ * auVar68._0_4_;
            auVar104._8_4_ = auVar107._8_4_ * auVar68._8_4_;
            auVar104._12_4_ = auVar107._12_4_ * auVar68._12_4_;
            auVar104._16_4_ = auVar107._16_4_ * auVar68._16_4_;
            auVar104._20_4_ = auVar107._20_4_ * auVar68._20_4_;
            auVar104._24_4_ = auVar107._24_4_ * auVar68._24_4_;
            auVar104._28_4_ = fVar113;
            auVar52 = vfmsub231ps_fma(auVar104,auVar55,auVar84);
            auVar6._4_4_ = auVar84._4_4_ * auVar7._4_4_;
            auVar6._0_4_ = auVar84._0_4_ * auVar7._0_4_;
            auVar6._8_4_ = auVar84._8_4_ * auVar7._8_4_;
            auVar6._12_4_ = auVar84._12_4_ * auVar7._12_4_;
            auVar6._16_4_ = auVar84._16_4_ * auVar7._16_4_;
            auVar6._20_4_ = auVar84._20_4_ * auVar7._20_4_;
            auVar6._24_4_ = auVar84._24_4_ * auVar7._24_4_;
            auVar6._28_4_ = auVar84._28_4_;
            auVar51 = vfmsub231ps_fma(auVar6,auVar68,auVar90);
            auVar14._4_4_ = auVar90._4_4_ * auVar55._4_4_;
            auVar14._0_4_ = auVar90._0_4_ * auVar55._0_4_;
            auVar14._8_4_ = auVar90._8_4_ * auVar55._8_4_;
            auVar14._12_4_ = auVar90._12_4_ * auVar55._12_4_;
            auVar14._16_4_ = auVar90._16_4_ * auVar55._16_4_;
            auVar14._20_4_ = auVar90._20_4_ * auVar55._20_4_;
            auVar14._24_4_ = auVar90._24_4_ * auVar55._24_4_;
            auVar14._28_4_ = auVar90._28_4_;
            auVar63 = vfmsub231ps_fma(auVar14,auVar7,auVar107);
            auVar91._0_4_ = local_ae0 * auVar63._0_4_;
            auVar91._4_4_ = local_ae0 * auVar63._4_4_;
            auVar91._8_4_ = local_ae0 * auVar63._8_4_;
            auVar91._12_4_ = local_ae0 * auVar63._12_4_;
            auVar91._16_4_ = local_ae0 * 0.0;
            auVar91._20_4_ = local_ae0 * 0.0;
            auVar91._24_4_ = local_ae0 * 0.0;
            auVar91._28_4_ = 0;
            auVar51 = vfmadd231ps_fma(auVar91,local_e40,ZEXT1632(auVar51));
            auVar51 = vfmadd231ps_fma(ZEXT1632(auVar51),local_e60,ZEXT1632(auVar52));
            fVar128 = auVar51._0_4_ + auVar45._0_4_ + auVar42._0_4_;
            fVar129 = auVar51._4_4_ + auVar45._4_4_ + auVar42._4_4_;
            fVar130 = auVar51._8_4_ + auVar45._8_4_ + auVar42._8_4_;
            fVar132 = auVar51._12_4_ + auVar45._12_4_ + auVar42._12_4_;
            local_d00 = ZEXT1632(CONCAT412(fVar132,CONCAT48(fVar130,CONCAT44(fVar129,fVar128))));
            auVar85._8_4_ = 0x7fffffff;
            auVar85._0_8_ = 0x7fffffff7fffffff;
            auVar85._12_4_ = 0x7fffffff;
            auVar85._16_4_ = 0x7fffffff;
            auVar85._20_4_ = 0x7fffffff;
            auVar85._24_4_ = 0x7fffffff;
            auVar85._28_4_ = 0x7fffffff;
            local_b80 = ZEXT1632(auVar45);
            auVar46 = vminps_avx(local_b80,ZEXT1632(auVar42));
            auVar46 = vminps_avx(auVar46,ZEXT1632(auVar51));
            local_be0 = vandps_avx(local_d00,auVar85);
            fVar113 = local_be0._0_4_ * 1.1920929e-07;
            fVar117 = local_be0._4_4_ * 1.1920929e-07;
            auVar15._4_4_ = fVar117;
            auVar15._0_4_ = fVar113;
            fVar118 = local_be0._8_4_ * 1.1920929e-07;
            auVar15._8_4_ = fVar118;
            fVar119 = local_be0._12_4_ * 1.1920929e-07;
            auVar15._12_4_ = fVar119;
            fVar120 = local_be0._16_4_ * 1.1920929e-07;
            auVar15._16_4_ = fVar120;
            fVar121 = local_be0._20_4_ * 1.1920929e-07;
            auVar15._20_4_ = fVar121;
            fVar122 = local_be0._24_4_ * 1.1920929e-07;
            auVar15._24_4_ = fVar122;
            auVar15._28_4_ = 0x34000000;
            auVar111._0_8_ = CONCAT44(fVar117,fVar113) ^ 0x8000000080000000;
            auVar111._8_4_ = -fVar118;
            auVar111._12_4_ = -fVar119;
            auVar111._16_4_ = -fVar120;
            auVar111._20_4_ = -fVar121;
            auVar111._24_4_ = -fVar122;
            auVar111._28_4_ = 0xb4000000;
            auVar46 = vcmpps_avx(auVar46,auVar111,5);
            auVar104 = ZEXT1632(auVar42);
            auVar54 = vmaxps_avx(local_b80,auVar104);
            auVar47 = vmaxps_avx(auVar54,ZEXT1632(auVar51));
            auVar47 = vcmpps_avx(auVar47,auVar15,2);
            auVar47 = vorps_avx(auVar46,auVar47);
            if ((((((((auVar47 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar47 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar47 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar47 >> 0x7f,0) != '\0') ||
                  (auVar47 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar47 >> 0xbf,0) != '\0') ||
                (auVar47 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar47[0x1f] < '\0') {
              auVar16._4_4_ = fVar137 * local_ac0._4_4_;
              auVar16._0_4_ = fVar134 * local_ac0._0_4_;
              auVar16._8_4_ = fVar139 * local_ac0._8_4_;
              auVar16._12_4_ = fVar141 * local_ac0._12_4_;
              auVar16._16_4_ = fVar142 * local_ac0._16_4_;
              auVar16._20_4_ = fVar143 * local_ac0._20_4_;
              auVar16._24_4_ = fVar144 * local_ac0._24_4_;
              auVar16._28_4_ = auVar46._28_4_;
              auVar17._4_4_ = fVar60 * auVar69._4_4_;
              auVar17._0_4_ = fVar58 * auVar69._0_4_;
              auVar17._8_4_ = fVar62 * auVar69._8_4_;
              auVar17._12_4_ = fVar136 * auVar69._12_4_;
              auVar17._16_4_ = fVar140 * auVar69._16_4_;
              auVar17._20_4_ = fVar148 * auVar69._20_4_;
              auVar17._24_4_ = fVar152 * auVar69._24_4_;
              auVar17._28_4_ = auVar54._28_4_;
              auVar45 = vfmsub213ps_fma(auVar69,local_b20,auVar16);
              auVar18._4_4_ = fVar59 * auVar55._4_4_;
              auVar18._0_4_ = fVar57 * auVar55._0_4_;
              auVar18._8_4_ = fVar61 * auVar55._8_4_;
              auVar18._12_4_ = fVar131 * auVar55._12_4_;
              auVar18._16_4_ = fVar138 * auVar55._16_4_;
              auVar18._20_4_ = fVar147 * auVar55._20_4_;
              auVar18._24_4_ = fVar149 * auVar55._24_4_;
              auVar18._28_4_ = 0x34000000;
              auVar19._4_4_ = fVar60 * auVar68._4_4_;
              auVar19._0_4_ = fVar58 * auVar68._0_4_;
              auVar19._8_4_ = fVar62 * auVar68._8_4_;
              auVar19._12_4_ = fVar136 * auVar68._12_4_;
              auVar19._16_4_ = fVar140 * auVar68._16_4_;
              auVar19._20_4_ = fVar148 * auVar68._20_4_;
              auVar19._24_4_ = fVar152 * auVar68._24_4_;
              auVar19._28_4_ = 0;
              auVar42 = vfmsub213ps_fma(auVar68,local_b00,auVar18);
              auVar46 = vandps_avx(auVar16,auVar85);
              auVar54 = vandps_avx(auVar18,auVar85);
              auVar46 = vcmpps_avx(auVar46,auVar54,1);
              local_b60 = vblendvps_avx(ZEXT1632(auVar42),ZEXT1632(auVar45),auVar46);
              auVar20._4_4_ = fVar137 * auVar7._4_4_;
              auVar20._0_4_ = fVar134 * auVar7._0_4_;
              auVar20._8_4_ = fVar139 * auVar7._8_4_;
              auVar20._12_4_ = fVar141 * auVar7._12_4_;
              auVar20._16_4_ = fVar142 * auVar7._16_4_;
              auVar20._20_4_ = fVar143 * auVar7._20_4_;
              auVar20._24_4_ = fVar144 * auVar7._24_4_;
              auVar20._28_4_ = local_b60._28_4_;
              auVar45 = vfmsub213ps_fma(auVar7,local_b20,auVar19);
              auVar21._4_4_ = local_aa0._4_4_ * fVar59;
              auVar21._0_4_ = local_aa0._0_4_ * fVar57;
              auVar21._8_4_ = local_aa0._8_4_ * fVar61;
              auVar21._12_4_ = local_aa0._12_4_ * fVar131;
              auVar21._16_4_ = local_aa0._16_4_ * fVar138;
              auVar21._20_4_ = local_aa0._20_4_ * fVar147;
              auVar21._24_4_ = local_aa0._24_4_ * fVar149;
              auVar21._28_4_ = auVar46._28_4_;
              auVar42 = vfmsub213ps_fma(local_ac0,local_b40,auVar21);
              auVar46 = vandps_avx(auVar21,auVar85);
              auVar54 = vandps_avx(auVar19,auVar85);
              auVar46 = vcmpps_avx(auVar46,auVar54,1);
              auVar68 = vblendvps_avx(ZEXT1632(auVar45),ZEXT1632(auVar42),auVar46);
              auVar45 = vfmsub213ps_fma(local_aa0,local_b00,auVar17);
              auVar42 = vfmsub213ps_fma(auVar55,local_b40,auVar20);
              auVar46 = vandps_avx(auVar17,auVar85);
              auVar54 = vandps_avx(auVar20,auVar85);
              auVar46 = vcmpps_avx(auVar46,auVar54,1);
              auVar46 = vblendvps_avx(ZEXT1632(auVar42),ZEXT1632(auVar45),auVar46);
              auVar45 = vpackssdw_avx(auVar47._0_16_,auVar47._16_16_);
              fVar113 = auVar46._0_4_;
              auVar86._0_4_ = fVar113 * local_ae0;
              fVar57 = auVar46._4_4_;
              auVar86._4_4_ = fVar57 * local_ae0;
              fVar58 = auVar46._8_4_;
              auVar86._8_4_ = fVar58 * local_ae0;
              fVar59 = auVar46._12_4_;
              auVar86._12_4_ = fVar59 * local_ae0;
              fVar60 = auVar46._16_4_;
              auVar86._16_4_ = fVar60 * local_ae0;
              fVar61 = auVar46._20_4_;
              auVar86._20_4_ = fVar61 * local_ae0;
              fVar62 = auVar46._24_4_;
              auVar86._24_4_ = fVar62 * local_ae0;
              auVar86._28_4_ = 0;
              auVar42 = vfmadd213ps_fma(local_e40,auVar68,auVar86);
              auVar42 = vfmadd213ps_fma(local_e60,local_b60,ZEXT1632(auVar42));
              auVar54 = ZEXT1632(CONCAT412(auVar42._12_4_ + auVar42._12_4_,
                                           CONCAT48(auVar42._8_4_ + auVar42._8_4_,
                                                    CONCAT44(auVar42._4_4_ + auVar42._4_4_,
                                                             auVar42._0_4_ + auVar42._0_4_))));
              auVar22._4_4_ = fVar57 * fVar150;
              auVar22._0_4_ = fVar113 * fVar145;
              auVar22._8_4_ = fVar58 * fVar87;
              auVar22._12_4_ = fVar59 * fVar125;
              auVar22._16_4_ = fVar60 * fVar127;
              auVar22._20_4_ = fVar61 * fVar133;
              auVar22._24_4_ = fVar62 * fVar93;
              auVar22._28_4_ = auVar47._28_4_;
              auVar42 = vfmadd213ps_fma(auVar48,auVar68,auVar22);
              auVar51 = vfmadd213ps_fma(auVar108,local_b60,ZEXT1632(auVar42));
              auVar46 = vrcpps_avx(auVar54);
              auVar115._8_4_ = 0x3f800000;
              auVar115._0_8_ = 0x3f8000003f800000;
              auVar115._12_4_ = 0x3f800000;
              auVar115._16_4_ = 0x3f800000;
              auVar115._20_4_ = 0x3f800000;
              auVar115._24_4_ = 0x3f800000;
              auVar115._28_4_ = 0x3f800000;
              auVar42 = vfnmadd213ps_fma(auVar46,auVar54,auVar115);
              auVar42 = vfmadd132ps_fma(ZEXT1632(auVar42),auVar46,auVar46);
              local_9a0 = ZEXT1632(CONCAT412(auVar42._12_4_ * (auVar51._12_4_ + auVar51._12_4_),
                                             CONCAT48(auVar42._8_4_ *
                                                      (auVar51._8_4_ + auVar51._8_4_),
                                                      CONCAT44(auVar42._4_4_ *
                                                               (auVar51._4_4_ + auVar51._4_4_),
                                                               auVar42._0_4_ *
                                                               (auVar51._0_4_ + auVar51._0_4_)))));
              uVar1 = *(undefined4 *)(local_e78 + local_e80 * 4 + 0x60);
              auVar108._4_4_ = uVar1;
              auVar108._0_4_ = uVar1;
              auVar108._8_4_ = uVar1;
              auVar108._12_4_ = uVar1;
              auVar108._16_4_ = uVar1;
              auVar108._20_4_ = uVar1;
              auVar108._24_4_ = uVar1;
              auVar108._28_4_ = uVar1;
              uVar1 = *(undefined4 *)(local_e78 + local_e80 * 4 + 0x100);
              local_d20._4_4_ = uVar1;
              local_d20._0_4_ = uVar1;
              local_d20._8_4_ = uVar1;
              local_d20._12_4_ = uVar1;
              local_d20._16_4_ = uVar1;
              local_d20._20_4_ = uVar1;
              local_d20._24_4_ = uVar1;
              local_d20._28_4_ = uVar1;
              auVar96 = ZEXT3264(local_d20);
              auVar46 = vcmpps_avx(auVar108,local_9a0,2);
              auVar47 = vcmpps_avx(local_9a0,local_d20,2);
              auVar46 = vandps_avx(auVar47,auVar46);
              auVar42 = vpackssdw_avx(auVar46._0_16_,auVar46._16_16_);
              auVar45 = vpand_avx(auVar42,auVar45);
              auVar46 = vpmovsxwd_avx2(auVar45);
              if ((((((((auVar46 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar46 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar46 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar46 >> 0x7f,0) != '\0') ||
                    (auVar46 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar46 >> 0xbf,0) != '\0') ||
                  (auVar46 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar46[0x1f] < '\0') {
                auVar46 = vcmpps_avx(auVar54,_DAT_01faff00,4);
                auVar42 = vpackssdw_avx(auVar46._0_16_,auVar46._16_16_);
                auVar45 = vpand_avx(auVar45,auVar42);
                local_a00 = vpmovsxwd_avx2(auVar45);
                if ((((((((local_a00 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (local_a00 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_a00 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(local_a00 >> 0x7f,0) != '\0') ||
                      (local_a00 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(local_a00 >> 0xbf,0) != '\0') ||
                    (local_a00 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    local_a00[0x1f] < '\0') {
                  local_a20 = &local_e81;
                  auVar46 = vsubps_avx(local_d00,auVar104);
                  local_a80 = vblendvps_avx(local_b80,auVar46,local_ba0);
                  auVar46 = vsubps_avx(local_d00,local_b80);
                  local_a60 = vblendvps_avx(auVar104,auVar46,local_ba0);
                  local_980[0] = local_b60._0_4_ * (float)local_bc0._0_4_;
                  local_980[1] = local_b60._4_4_ * (float)local_bc0._4_4_;
                  local_980[2] = local_b60._8_4_ * fStack_bb8;
                  local_980[3] = local_b60._12_4_ * fStack_bb4;
                  fStack_970 = local_b60._16_4_ * fStack_bb0;
                  fStack_96c = local_b60._20_4_ * fStack_bac;
                  fStack_968 = local_b60._24_4_ * fStack_ba8;
                  uStack_964 = local_ba0._28_4_;
                  local_960[0] = (float)local_bc0._0_4_ * auVar68._0_4_;
                  local_960[1] = (float)local_bc0._4_4_ * auVar68._4_4_;
                  local_960[2] = fStack_bb8 * auVar68._8_4_;
                  local_960[3] = fStack_bb4 * auVar68._12_4_;
                  fStack_950 = fStack_bb0 * auVar68._16_4_;
                  fStack_94c = fStack_bac * auVar68._20_4_;
                  fStack_948 = fStack_ba8 * auVar68._24_4_;
                  uStack_944 = auVar68._28_4_;
                  local_940._4_4_ = (float)local_bc0._4_4_ * fVar57;
                  local_940._0_4_ = (float)local_bc0._0_4_ * fVar113;
                  local_940._8_4_ = fStack_bb8 * fVar58;
                  local_940._12_4_ = fStack_bb4 * fVar59;
                  local_940._16_4_ = fStack_bb0 * fVar60;
                  local_940._20_4_ = fStack_bac * fVar61;
                  local_940._24_4_ = fStack_ba8 * fVar62;
                  local_940._28_4_ = auVar68._28_4_;
                  pGVar4 = (context->scene->geometries).items[local_e68].ptr;
                  if ((pGVar4->mask & *(uint *)(local_e78 + local_e80 * 4 + 0x120)) != 0) {
                    sVar27 = local_e80;
                    pRVar33 = local_e78;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_005a6058:
                      *(undefined4 *)(pRVar33 + sVar27 * 4 + 0x100) = 0xff800000;
                      return bVar41;
                    }
                    auVar50._0_8_ = (ulong)CONCAT24(uVar2,(uint)uVar2) & 0x7fff00007fff;
                    auVar50._8_4_ = local_e6c;
                    auVar50._12_4_ = local_e6c;
                    auVar50._16_4_ = local_e6c;
                    auVar50._20_4_ = local_e6c;
                    auVar50._24_4_ = local_e6c;
                    auVar50._28_4_ = local_e6c;
                    auVar46 = vpaddd_avx2(auVar50,_DAT_01fec4a0);
                    auVar56._0_8_ = (ulong)CONCAT24(uVar3,(uint)uVar3) & 0x7fff00007fff;
                    auVar56._8_4_ = local_e70;
                    auVar56._12_4_ = local_e70;
                    auVar56._16_4_ = local_e70;
                    auVar56._20_4_ = local_e70;
                    auVar56._24_4_ = local_e70;
                    auVar56._28_4_ = local_e70;
                    auVar95._0_4_ = (float)(int)(*(ushort *)(local_dc8 + 8 + local_dd0) - 1);
                    auVar95._4_12_ = local_b00._4_12_;
                    auVar54 = vpaddd_avx2(auVar56,_DAT_01fec4c0);
                    auVar42 = vrcpss_avx(auVar95,auVar95);
                    auVar51 = vfnmadd213ss_fma(auVar95,auVar42,SUB6416(ZEXT464(0x40000000),0));
                    fVar145 = auVar42._0_4_ * auVar51._0_4_;
                    auVar98._0_4_ = (float)(int)(*(ushort *)(local_dc8 + 10 + local_dd0) - 1);
                    auVar98._4_12_ = local_b00._4_12_;
                    auVar42 = vrcpss_avx(auVar98,auVar98);
                    auVar51 = vfnmadd213ss_fma(auVar98,auVar42,SUB6416(ZEXT464(0x40000000),0));
                    fVar150 = auVar42._0_4_ * auVar51._0_4_;
                    auVar47 = vcvtdq2ps_avx(auVar46);
                    auVar54 = vcvtdq2ps_avx(auVar54);
                    auVar46 = vrcpps_avx(local_d00);
                    auVar92._8_4_ = 0x3f800000;
                    auVar92._0_8_ = 0x3f8000003f800000;
                    auVar92._12_4_ = 0x3f800000;
                    auVar92._16_4_ = 0x3f800000;
                    auVar92._20_4_ = 0x3f800000;
                    auVar92._24_4_ = 0x3f800000;
                    auVar92._28_4_ = 0x3f800000;
                    auVar42 = vfnmadd213ps_fma(local_d00,auVar46,auVar92);
                    auVar42 = vfmadd132ps_fma(ZEXT1632(auVar42),auVar46,auVar46);
                    auVar71._8_4_ = 0x219392ef;
                    auVar71._0_8_ = 0x219392ef219392ef;
                    auVar71._12_4_ = 0x219392ef;
                    auVar71._16_4_ = 0x219392ef;
                    auVar71._20_4_ = 0x219392ef;
                    auVar71._24_4_ = 0x219392ef;
                    auVar71._28_4_ = 0x219392ef;
                    auVar46 = vcmpps_avx(local_be0,auVar71,5);
                    auVar46 = vandps_avx(ZEXT1632(auVar42),auVar46);
                    auVar23._4_4_ =
                         (fVar129 * auVar47._4_4_ + local_a80._4_4_) * fVar145 * auVar46._4_4_;
                    auVar23._0_4_ =
                         (fVar128 * auVar47._0_4_ + local_a80._0_4_) * fVar145 * auVar46._0_4_;
                    auVar23._8_4_ =
                         (fVar130 * auVar47._8_4_ + local_a80._8_4_) * fVar145 * auVar46._8_4_;
                    auVar23._12_4_ =
                         (fVar132 * auVar47._12_4_ + local_a80._12_4_) * fVar145 * auVar46._12_4_;
                    auVar23._16_4_ =
                         (auVar47._16_4_ * 0.0 + local_a80._16_4_) * fVar145 * auVar46._16_4_;
                    auVar23._20_4_ =
                         (auVar47._20_4_ * 0.0 + local_a80._20_4_) * fVar145 * auVar46._20_4_;
                    auVar23._24_4_ =
                         (auVar47._24_4_ * 0.0 + local_a80._24_4_) * fVar145 * auVar46._24_4_;
                    auVar23._28_4_ = auVar47._28_4_ + local_a80._28_4_;
                    local_9e0 = vminps_avx(auVar23,auVar92);
                    auVar24._4_4_ =
                         (fVar129 * auVar54._4_4_ + local_a60._4_4_) * fVar150 * auVar46._4_4_;
                    auVar24._0_4_ =
                         (fVar128 * auVar54._0_4_ + local_a60._0_4_) * fVar150 * auVar46._0_4_;
                    auVar24._8_4_ =
                         (fVar130 * auVar54._8_4_ + local_a60._8_4_) * fVar150 * auVar46._8_4_;
                    auVar24._12_4_ =
                         (fVar132 * auVar54._12_4_ + local_a60._12_4_) * fVar150 * auVar46._12_4_;
                    auVar24._16_4_ =
                         (auVar54._16_4_ * 0.0 + local_a60._16_4_) * fVar150 * auVar46._16_4_;
                    auVar24._20_4_ =
                         (auVar54._20_4_ * 0.0 + local_a60._20_4_) * fVar150 * auVar46._20_4_;
                    auVar24._24_4_ =
                         (auVar54._24_4_ * 0.0 + local_a60._24_4_) * fVar150 * auVar46._24_4_;
                    auVar24._28_4_ = local_9e0._28_4_;
                    local_9c0 = vminps_avx(auVar24,auVar92);
                    if ((((((((((((((((auVar45 >> 7 & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar45 >> 0xf & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar45 >> 0x17 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                   (auVar45 >> 0x1f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar45 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar45 >> 0x2f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar45 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar45 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar45 >> 0x47 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar45 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar45 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar45 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar45 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar45 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar45 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar45[0xf] < '\0') {
                      auVar45 = vpacksswb_avx(auVar45,auVar45);
                      uVar34 = 0;
                      uVar38 = (ulong)(byte)(SUB161(auVar45 >> 7,0) & 1 |
                                             (SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                                             (SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                                             (SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                                             (SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                                             (SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                                             (SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                                            SUB161(auVar45 >> 0x3f,0) << 7);
                      for (uVar35 = uVar38; (uVar35 & 1) == 0;
                          uVar35 = uVar35 >> 1 | 0x8000000000000000) {
                        uVar34 = uVar34 + 1;
                      }
                      local_cc0._0_4_ = local_cc0._4_4_;
                      uStack_cb8._0_4_ = local_cc0._4_4_;
                      uStack_cb8._4_4_ = local_cc0._4_4_;
                      uStack_cb0._0_4_ = local_cc0._4_4_;
                      uStack_cb0._4_4_ = local_cc0._4_4_;
                      uStack_ca8._0_4_ = local_cc0._4_4_;
                      uStack_ca8._4_4_ = local_cc0._4_4_;
                      local_ce0._0_4_ = local_ce0._4_4_;
                      uStack_cd8._0_4_ = local_ce0._4_4_;
                      uStack_cd8._4_4_ = local_ce0._4_4_;
                      uStack_cd0._0_4_ = local_ce0._4_4_;
                      uStack_cd0._4_4_ = local_ce0._4_4_;
                      uStack_cc8._0_4_ = local_ce0._4_4_;
                      uStack_cc8._4_4_ = local_ce0._4_4_;
                      fStack_adc = local_ae0;
                      fStack_ad8 = local_ae0;
                      fStack_ad4 = local_ae0;
                      fStack_ad0 = local_ae0;
                      fStack_acc = local_ae0;
                      fStack_ac8 = local_ae0;
                      fStack_ac4 = local_ae0;
                      local_a40 = local_d00;
                      do {
                        local_8c0 = *(undefined4 *)(local_9e0 + uVar34 * 4);
                        local_8a0 = *(undefined4 *)(local_9c0 + uVar34 * 4);
                        *(float *)(pRVar33 + sVar27 * 4 + 0x100) = local_980[uVar34 - 8];
                        fVar145 = local_980[uVar34];
                        auVar72._4_4_ = fVar145;
                        auVar72._0_4_ = fVar145;
                        auVar72._8_4_ = fVar145;
                        auVar72._12_4_ = fVar145;
                        auVar72._16_4_ = fVar145;
                        auVar72._20_4_ = fVar145;
                        auVar72._24_4_ = fVar145;
                        auVar72._28_4_ = fVar145;
                        fVar150 = local_960[uVar34];
                        local_900._4_4_ = fVar150;
                        local_900._0_4_ = fVar150;
                        local_900._8_4_ = fVar150;
                        local_900._12_4_ = fVar150;
                        local_900._16_4_ = fVar150;
                        local_900._20_4_ = fVar150;
                        local_900._24_4_ = fVar150;
                        local_900._28_4_ = fVar150;
                        local_8e0 = *(undefined4 *)(local_940 + uVar34 * 4);
                        local_d50.context = context->user;
                        local_920[0] = (RTCHitN)SUB41(fVar145,0);
                        local_920[1] = (RTCHitN)(char)((uint)fVar145 >> 8);
                        local_920[2] = (RTCHitN)(char)((uint)fVar145 >> 0x10);
                        local_920[3] = (RTCHitN)(char)((uint)fVar145 >> 0x18);
                        local_920[4] = (RTCHitN)SUB41(fVar145,0);
                        local_920[5] = (RTCHitN)(char)((uint)fVar145 >> 8);
                        local_920[6] = (RTCHitN)(char)((uint)fVar145 >> 0x10);
                        local_920[7] = (RTCHitN)(char)((uint)fVar145 >> 0x18);
                        local_920[8] = (RTCHitN)SUB41(fVar145,0);
                        local_920[9] = (RTCHitN)(char)((uint)fVar145 >> 8);
                        local_920[10] = (RTCHitN)(char)((uint)fVar145 >> 0x10);
                        local_920[0xb] = (RTCHitN)(char)((uint)fVar145 >> 0x18);
                        local_920[0xc] = (RTCHitN)SUB41(fVar145,0);
                        local_920[0xd] = (RTCHitN)(char)((uint)fVar145 >> 8);
                        local_920[0xe] = (RTCHitN)(char)((uint)fVar145 >> 0x10);
                        local_920[0xf] = (RTCHitN)(char)((uint)fVar145 >> 0x18);
                        local_920[0x10] = (RTCHitN)SUB41(fVar145,0);
                        local_920[0x11] = (RTCHitN)(char)((uint)fVar145 >> 8);
                        local_920[0x12] = (RTCHitN)(char)((uint)fVar145 >> 0x10);
                        local_920[0x13] = (RTCHitN)(char)((uint)fVar145 >> 0x18);
                        local_920[0x14] = (RTCHitN)SUB41(fVar145,0);
                        local_920[0x15] = (RTCHitN)(char)((uint)fVar145 >> 8);
                        local_920[0x16] = (RTCHitN)(char)((uint)fVar145 >> 0x10);
                        local_920[0x17] = (RTCHitN)(char)((uint)fVar145 >> 0x18);
                        local_920[0x18] = (RTCHitN)SUB41(fVar145,0);
                        local_920[0x19] = (RTCHitN)(char)((uint)fVar145 >> 8);
                        local_920[0x1a] = (RTCHitN)(char)((uint)fVar145 >> 0x10);
                        local_920[0x1b] = (RTCHitN)(char)((uint)fVar145 >> 0x18);
                        local_920[0x1c] = (RTCHitN)SUB41(fVar145,0);
                        local_920[0x1d] = (RTCHitN)(char)((uint)fVar145 >> 8);
                        local_920[0x1e] = (RTCHitN)(char)((uint)fVar145 >> 0x10);
                        local_920[0x1f] = (RTCHitN)(char)((uint)fVar145 >> 0x18);
                        uStack_8dc = local_8e0;
                        uStack_8d8 = local_8e0;
                        uStack_8d4 = local_8e0;
                        uStack_8d0 = local_8e0;
                        uStack_8cc = local_8e0;
                        uStack_8c8 = local_8e0;
                        uStack_8c4 = local_8e0;
                        uStack_8bc = local_8c0;
                        uStack_8b8 = local_8c0;
                        uStack_8b4 = local_8c0;
                        uStack_8b0 = local_8c0;
                        uStack_8ac = local_8c0;
                        uStack_8a8 = local_8c0;
                        uStack_8a4 = local_8c0;
                        uStack_89c = local_8a0;
                        uStack_898 = local_8a0;
                        uStack_894 = local_8a0;
                        uStack_890 = local_8a0;
                        uStack_88c = local_8a0;
                        uStack_888 = local_8a0;
                        uStack_884 = local_8a0;
                        local_880 = local_ce0;
                        uStack_878 = uStack_cd8;
                        uStack_870 = uStack_cd0;
                        uStack_868 = uStack_cc8;
                        local_860 = local_cc0;
                        uStack_858 = uStack_cb8;
                        uStack_850 = uStack_cb0;
                        uStack_848 = uStack_ca8;
                        auVar46 = vpcmpeqd_avx2(auVar72,auVar72);
                        uStack_83c = (local_d50.context)->instID[0];
                        local_840 = uStack_83c;
                        uStack_838 = uStack_83c;
                        uStack_834 = uStack_83c;
                        uStack_830 = uStack_83c;
                        uStack_82c = uStack_83c;
                        uStack_828 = uStack_83c;
                        uStack_824 = uStack_83c;
                        uStack_81c = (local_d50.context)->instPrimID[0];
                        local_820 = uStack_81c;
                        uStack_818 = uStack_81c;
                        uStack_814 = uStack_81c;
                        uStack_810 = uStack_81c;
                        uStack_80c = uStack_81c;
                        uStack_808 = uStack_81c;
                        uStack_804 = uStack_81c;
                        local_ca0 = local_c00;
                        local_d50.valid = (int *)local_ca0;
                        local_d50.geometryUserPtr = pGVar4->userPtr;
                        local_d50.hit = local_920;
                        local_d50.N = 8;
                        uVar35 = uVar34;
                        local_d50.ray = (RTCRayN *)pRVar33;
                        if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          local_e40._0_8_ = uVar34;
                          local_e60._0_8_ = uVar38;
                          auVar46 = ZEXT1632(auVar46._0_16_);
                          (*pGVar4->occlusionFilterN)(&local_d50);
                          auVar96 = ZEXT3264(local_d20);
                          auVar46 = vpcmpeqd_avx2(auVar46,auVar46);
                          sVar27 = local_e80;
                          uVar38 = local_e60._0_8_;
                          uVar35 = local_e40._0_8_;
                          pRVar33 = local_e78;
                        }
                        auVar54 = vpcmpeqd_avx2(local_ca0,_DAT_01faff00);
                        auVar47 = auVar46 & ~auVar54;
                        if ((((((((auVar47 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 && (auVar47 >> 0x3f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar47 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar47 >> 0x7f,0) == '\0') &&
                              (auVar47 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                             SUB321(auVar47 >> 0xbf,0) == '\0') &&
                            (auVar47 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar47[0x1f]) {
                          auVar54 = auVar54 ^ auVar46;
                        }
                        else {
                          p_Var5 = context->args->filter;
                          if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            local_e40._0_8_ = uVar35;
                            local_e60._0_8_ = uVar38;
                            auVar46 = ZEXT1632(auVar46._0_16_);
                            (*p_Var5)(&local_d50);
                            auVar96 = ZEXT3264(local_d20);
                            auVar46 = vpcmpeqd_avx2(auVar46,auVar46);
                            sVar27 = local_e80;
                            uVar38 = local_e60._0_8_;
                            uVar35 = local_e40._0_8_;
                            pRVar33 = local_e78;
                          }
                          auVar47 = vpcmpeqd_avx2(local_ca0,_DAT_01faff00);
                          auVar54 = auVar47 ^ auVar46;
                          auVar73._8_4_ = 0xff800000;
                          auVar73._0_8_ = 0xff800000ff800000;
                          auVar73._12_4_ = 0xff800000;
                          auVar73._16_4_ = 0xff800000;
                          auVar73._20_4_ = 0xff800000;
                          auVar73._24_4_ = 0xff800000;
                          auVar73._28_4_ = 0xff800000;
                          auVar46 = vblendvps_avx(auVar73,*(undefined1 (*) [32])
                                                           (local_d50.ray + 0x100),auVar47);
                          *(undefined1 (*) [32])(local_d50.ray + 0x100) = auVar46;
                        }
                        if ((((((((auVar54 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar54 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar54 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar54 >> 0x7f,0) != '\0') ||
                              (auVar54 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar54 >> 0xbf,0) != '\0') ||
                            (auVar54 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar54[0x1f] < '\0') goto LAB_005a6058;
                        *(int *)(pRVar33 + sVar27 * 4 + 0x100) = auVar96._0_4_;
                        uVar34 = 0;
                        uVar38 = uVar38 ^ 1L << (uVar35 & 0x3f);
                        for (uVar35 = uVar38; (uVar35 & 1) == 0;
                            uVar35 = uVar35 >> 1 | 0x8000000000000000) {
                          uVar34 = uVar34 + 1;
                        }
                      } while (uVar38 != 0);
                    }
                  }
                }
              }
            }
            local_dd8 = local_dd8 - 1 & local_dd8;
            auVar112 = ZEXT1664(local_c10);
            auVar116 = ZEXT1664(local_c20);
            auVar124 = ZEXT1664(local_c30);
            uVar34 = local_df8;
            uVar35 = local_e00;
            fVar125 = local_c40;
            fVar58 = fStack_c3c;
            fVar59 = fStack_c38;
            fVar60 = fStack_c34;
            fVar127 = local_c50;
            fVar61 = fStack_c4c;
            fVar62 = fStack_c48;
            fVar131 = fStack_c44;
            fVar133 = local_c60;
            fVar136 = fStack_c5c;
            fVar138 = fStack_c58;
            fVar140 = fStack_c54;
            fVar145 = local_c70;
            fVar147 = fStack_c6c;
            fVar148 = fStack_c68;
            fVar149 = fStack_c64;
            fVar150 = local_c80;
            fVar152 = fStack_c7c;
            fVar117 = fStack_c78;
            fVar118 = fStack_c74;
          } while (local_dd8 != 0);
        }
        auVar105 = ZEXT1664(local_d80);
        auVar96 = ZEXT1664(local_d70);
        local_df0 = local_df0 + 1;
        fVar87 = local_d60;
        fVar93 = fStack_d5c;
        fVar113 = fStack_d58;
        fVar57 = fStack_d54;
      } while (local_df0 != local_de8);
    }
LAB_005a6042:
    bVar41 = local_de0 != &local_800;
    if (!bVar41) {
      return bVar41;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }